

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5DecodeFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  void *pvVar1;
  Fts5StructureSegment *pFVar2;
  Fts5StructureLevel *pFVar3;
  u32 uVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  void *__src;
  ushort *puVar15;
  char *pcVar16;
  uint uVar17;
  long lVar18;
  Fts5StructureLevel *pFVar19;
  uint uVar20;
  ulong __n;
  long lVar21;
  int rc;
  int nKeep;
  Fts5Buffer s;
  Fts5Buffer term;
  int iTermOff;
  int nIncr;
  int nAppend;
  int local_b8;
  u32 local_b4;
  ushort *local_b0;
  Fts5Buffer local_a8;
  Fts5StructureLevel *local_90;
  ulong local_88;
  Fts5Structure *local_80;
  Fts5DlidxLvl local_78;
  undefined8 local_50;
  int local_48;
  u32 local_40;
  u32 local_3c;
  sqlite3_context *local_38;
  
  local_b8 = 0;
  pvVar1 = pCtx->pFunc->pUserData;
  local_a8.p = (u8 *)0x0;
  local_a8.n = 0;
  local_a8.nSpace = 0;
  local_38 = pCtx;
  uVar14 = sqlite3VdbeIntValue(*apVal);
  uVar8 = sqlite3ValueBytes(apVal[1],'\x01');
  __n = (ulong)uVar8;
  __src = sqlite3_value_blob(apVal[1]);
  puVar15 = (ushort *)sqlite3Fts5MallocZero(&local_b8,(long)(int)(uVar8 + 8));
  iVar9 = local_b8;
  if (puVar15 == (ushort *)0x0) goto LAB_001add50;
  if (0 < (int)uVar8) {
    memcpy(puVar15,__src,__n);
  }
  uVar8 = (uint)(uVar14 >> 0x25) & 0xffff;
  local_88 = __n;
  if (uVar8 == 0) {
    if (uVar14 == 1) {
      pcVar16 = "{averages} ";
    }
    else {
      pcVar16 = "{structure}";
    }
    sqlite3Fts5BufferAppendPrintf(&local_b8,&local_a8,pcVar16);
  }
  else {
    pcVar16 = "dlidx ";
    if ((uVar14 & 0x1000000000) == 0) {
      pcVar16 = "";
    }
    sqlite3Fts5BufferAppendPrintf
              (&local_b8,&local_a8,"{%ssegid=%d h=%d pgno=%d}",pcVar16,(ulong)uVar8,
               (ulong)((uint)(uVar14 >> 0x1f) & 0x1f),(uint)uVar14 & 0x7fffffff);
  }
  iVar10 = (int)local_88;
  local_b0 = puVar15;
  if ((uVar14 & 0x1000000000) != 0) {
    local_78.pData = (Fts5Data *)&local_50;
    local_78.iOff = 0;
    local_78.bEof = 0;
    local_78.iRowid = 0;
    local_78._16_8_ = (uVar14 & 0x7fffffff) << 0x20;
    local_50 = puVar15;
    local_48 = iVar10;
    fts5DlidxLvlNext(&local_78);
    puVar15 = local_b0;
    iVar9 = local_b8;
    if (local_78.bEof == 0) {
      do {
        sqlite3Fts5BufferAppendPrintf
                  (&local_b8,&local_a8," %d(%lld)",(ulong)local_78._16_8_ >> 0x20,local_78.iRowid);
        fts5DlidxLvlNext(&local_78);
        puVar15 = local_b0;
        iVar9 = local_b8;
      } while (local_78.bEof == 0);
    }
    goto LAB_001add50;
  }
  if (uVar8 == 0) {
    if (uVar14 == 1) {
      iVar9 = local_b8;
      if (0 < iVar10) {
        uVar14 = 0;
        pcVar16 = "";
        do {
          bVar5 = sqlite3Fts5GetVarint((uchar *)(uVar14 + (long)puVar15),(u64 *)&local_78);
          uVar8 = (int)uVar14 + (uint)bVar5;
          uVar14 = (ulong)uVar8;
          sqlite3Fts5BufferAppendPrintf
                    (&local_b8,&local_a8,"%s%d",pcVar16,(ulong)local_78.pData & 0xffffffff);
          pcVar16 = " ";
          iVar9 = local_b8;
        } while ((int)uVar8 < iVar10);
      }
    }
    else {
      local_78.pData = (Fts5Data *)0x0;
      iVar9 = fts5StructureDecode((u8 *)puVar15,iVar10,(int *)0x0,(Fts5Structure **)&local_78);
      puVar15 = local_b0;
      if (iVar9 == 0) {
        local_80 = (Fts5Structure *)local_78.pData;
        if (0 < *(int *)((long)local_78.pData + 0x14)) {
          local_90 = (Fts5StructureLevel *)((long)local_78.pData + 0x18);
          uVar14 = 0;
          do {
            pFVar19 = local_90;
            local_88 = uVar14;
            sqlite3Fts5BufferAppendPrintf
                      (&local_b8,&local_a8," {lvl=%d nMerge=%d nSeg=%d",uVar14,
                       (ulong)(uint)local_90[uVar14].nMerge,(ulong)(uint)local_90[uVar14].nSeg);
            pFVar3 = local_90;
            if (0 < pFVar19[uVar14].nSeg) {
              lVar18 = 8;
              lVar21 = 0;
              do {
                pFVar2 = pFVar3[uVar14].aSeg;
                sqlite3Fts5BufferAppendPrintf
                          (&local_b8,&local_a8," {id=%d leaves=%d..%d}",
                           (ulong)*(uint *)((long)pFVar2 + lVar18 + -8),
                           (ulong)*(uint *)((long)pFVar2 + lVar18 + -4),
                           (ulong)*(uint *)((long)&pFVar2->iSegid + lVar18));
                lVar21 = lVar21 + 1;
                lVar18 = lVar18 + 0xc;
              } while (lVar21 < pFVar3[uVar14].nSeg);
            }
            sqlite3Fts5BufferAppendPrintf(&local_b8,&local_a8,"}");
            uVar14 = local_88 + 1;
          } while ((long)uVar14 < (long)local_80->nLevel);
        }
        fts5StructureRelease(local_80);
        puVar15 = local_b0;
        iVar9 = local_b8;
      }
    }
    goto LAB_001add50;
  }
  if (pvVar1 != (void *)0x0) {
    uVar6 = puVar15[1] << 8 | puVar15[1] >> 8;
    local_b4 = 0;
    local_78.pData = (Fts5Data *)0x0;
    local_78.iOff = 0;
    local_78.bEof = 0;
    uVar8 = (uint)uVar6;
    if ((int)(uint)uVar6 < iVar10) {
      iVar9 = sqlite3Fts5GetVarint32((uchar *)((long)puVar15 + (ulong)uVar6),(u32 *)&local_50);
      local_90 = (Fts5StructureLevel *)CONCAT44(local_90._4_4_,iVar9 + (uint)uVar6);
    }
    else {
      local_50 = (ushort *)CONCAT44(local_50._4_4_,uVar8);
      local_90 = (Fts5StructureLevel *)CONCAT44(local_90._4_4_,uVar8);
    }
    uVar20 = (uint)local_50;
    fts5DecodeRowidList(&local_b8,&local_a8,(u8 *)(puVar15 + 2),(uint)local_50 - 4);
    puVar15 = local_b0;
    uVar17 = uVar20;
    while ((int)uVar20 < (int)uVar8) {
      iVar10 = sqlite3Fts5GetVarint32((uchar *)((long)(int)uVar20 + (long)puVar15),&local_3c);
      uVar4 = local_3c;
      local_78.iOff = local_b4;
      sqlite3Fts5BufferAppendBlob
                (&local_b8,(Fts5Buffer *)&local_78,local_3c,
                 (u8 *)((long)(int)(uVar20 + iVar10) + (long)puVar15));
      sqlite3Fts5BufferAppendPrintf
                (&local_b8,&local_a8," term=%.*s",local_78._8_8_ & 0xffffffff,local_78.pData);
      iVar9 = (int)local_90;
      uVar12 = uVar8;
      if ((int)local_90 < (int)(uint)local_88) {
        iVar11 = sqlite3Fts5GetVarint32((uchar *)((long)(int)local_90 + (long)puVar15),&local_40);
        local_90 = (Fts5StructureLevel *)CONCAT44(local_90._4_4_,iVar9 + iVar11);
        uVar12 = uVar17 + local_40;
      }
      iVar9 = uVar4 + uVar20 + iVar10;
      fts5DecodeRowidList(&local_b8,&local_a8,(u8 *)((long)iVar9 + (long)puVar15),uVar12 - iVar9);
      uVar20 = uVar12;
      uVar17 = uVar12;
      if ((int)uVar12 < (int)uVar8) {
        iVar9 = sqlite3Fts5GetVarint32((uchar *)((long)(int)uVar12 + (long)puVar15),&local_b4);
        uVar20 = iVar9 + uVar12;
      }
    }
    local_50._4_4_ = (uint)((ulong)local_50 >> 0x20);
    local_50 = (ushort *)CONCAT44(local_50._4_4_,uVar17);
    sqlite3_free(local_78.pData);
    puVar15 = local_b0;
    iVar9 = local_b8;
    goto LAB_001add50;
  }
  local_50 = (ushort *)((ulong)local_50._4_4_ << 0x20);
  local_78.pData = (Fts5Data *)0x0;
  local_78.iOff = 0;
  local_78.bEof = 0;
  if (iVar10 < 4) {
    local_a8._8_8_ = local_a8._8_8_ & 0xffffffff00000000;
    sqlite3Fts5BufferAppendBlob(&local_b8,&local_a8,7,"corrupt");
    puVar15 = local_b0;
    iVar9 = local_b8;
    goto LAB_001add50;
  }
  uVar6 = *puVar15;
  uVar7 = puVar15[1] << 8 | puVar15[1] >> 8;
  if ((int)(uint)uVar7 < iVar10) {
    sqlite3Fts5GetVarint32((uchar *)((ulong)uVar7 + (long)puVar15),(u32 *)&local_50);
LAB_001add03:
    puVar15 = local_b0;
    uVar6 = uVar6 << 8 | uVar6 >> 8;
    uVar8 = (uint)local_50;
    if ((uint)local_50 == 0) {
      uVar8 = (uint)uVar7;
    }
    uVar20 = (uint)uVar6;
    if (uVar6 == 0) {
      uVar20 = uVar8;
    }
    if (((int)uVar20 <= iVar10) &&
       (fts5DecodePoslist(&local_b8,&local_a8,(u8 *)(local_b0 + 2),uVar20 - 4), (int)uVar8 <= iVar10
       )) {
      fts5DecodeDoclist(&local_b8,&local_a8,(u8 *)((long)(int)uVar20 + (long)puVar15),uVar8 - uVar20
                       );
      if (((int)(uint)uVar7 < iVar10) && (local_b8 == 0)) {
        local_80 = (Fts5Structure *)CONCAT44(local_80._4_4_,(uint)uVar7);
        pFVar19 = (Fts5StructureLevel *)0x0;
        uVar8 = (uint)uVar7;
        uVar20 = (uint)uVar7;
        while( true ) {
          iVar9 = sqlite3Fts5GetVarint32((uchar *)((ulong)uVar8 + (long)local_b0),&local_b4);
          uVar12 = iVar9 + uVar8;
          pFVar19 = (Fts5StructureLevel *)((long)(int)pFVar19 + (long)(int)local_b4);
          iVar9 = (int)pFVar19;
          uVar17 = uVar20;
          if ((int)uVar12 < iVar10) {
            sqlite3Fts5GetVarint32((uchar *)((ulong)uVar12 + (long)local_b0),&local_b4);
            uVar17 = local_b4 + iVar9;
          }
          puVar15 = local_b0;
          if ((int)uVar20 < (int)uVar17) break;
          local_88 = CONCAT44(local_88._4_4_,uVar12);
          if (uVar8 != uVar20) {
            iVar11 = sqlite3Fts5GetVarint32
                               ((uchar *)((long)&pFVar19->nMerge + (long)local_b0),&local_b4);
            if (local_78.iOff < (int)local_b4) break;
            iVar9 = iVar11 + iVar9;
            local_78.iOff = local_b4;
          }
          local_90 = pFVar19;
          iVar13 = sqlite3Fts5GetVarint32((uchar *)((long)puVar15 + (long)iVar9),&local_b4);
          iVar11 = iVar9 + iVar13 + local_b4;
          if (iVar10 < iVar11) break;
          sqlite3Fts5BufferAppendBlob
                    (&local_b8,(Fts5Buffer *)&local_78,local_b4,
                     (u8 *)((long)(iVar9 + iVar13) + (long)puVar15));
          sqlite3Fts5BufferAppendPrintf
                    (&local_b8,&local_a8," term=%.*s",local_78._8_8_ & 0xffffffff,local_78.pData);
          fts5DecodeDoclist(&local_b8,&local_a8,(u8 *)((long)iVar11 + (long)puVar15),uVar17 - iVar11
                           );
          if ((iVar10 <= (int)(uint)local_88) ||
             (pFVar19 = local_90, uVar8 = (uint)local_88, uVar20 = (uint)local_80, local_b8 != 0))
          goto LAB_001adf09;
        }
        local_b8 = 0x10b;
      }
LAB_001adf09:
      sqlite3_free(local_78.pData);
      local_78.pData = (Fts5Data *)0x0;
      local_78.iOff = 0;
      local_78.bEof = 0;
      puVar15 = local_b0;
      iVar9 = local_b8;
      goto LAB_001add50;
    }
  }
  else if ((int)(uint)uVar7 <= iVar10) goto LAB_001add03;
  local_b8 = 0x10b;
  puVar15 = local_b0;
  iVar9 = local_b8;
LAB_001add50:
  local_b8 = iVar9;
  sqlite3_free(puVar15);
  if (local_b8 == 0) {
    setResultStrOrError(local_38,(char *)local_a8.p,local_a8.n,'\x01',
                        (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(local_38,local_b8);
  }
  sqlite3_free(local_a8.p);
  return;
}

Assistant:

static void fts5DecodeFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args (always 2) */
  sqlite3_value **apVal           /* Function arguments */
){
  i64 iRowid;                     /* Rowid for record being decoded */
  int iSegid,iHeight,iPgno,bDlidx;/* Rowid components */
  const u8 *aBlob; int n;         /* Record to decode */
  u8 *a = 0;
  Fts5Buffer s;                   /* Build up text to return here */
  int rc = SQLITE_OK;             /* Return code */
  sqlite3_int64 nSpace = 0;
  int eDetailNone = (sqlite3_user_data(pCtx)!=0);

  assert( nArg==2 );
  UNUSED_PARAM(nArg);
  memset(&s, 0, sizeof(Fts5Buffer));
  iRowid = sqlite3_value_int64(apVal[0]);

  /* Make a copy of the second argument (a blob) in aBlob[]. The aBlob[]
  ** copy is followed by FTS5_DATA_ZERO_PADDING 0x00 bytes, which prevents
  ** buffer overreads even if the record is corrupt.  */
  n = sqlite3_value_bytes(apVal[1]);
  aBlob = sqlite3_value_blob(apVal[1]);
  nSpace = n + FTS5_DATA_ZERO_PADDING;
  a = (u8*)sqlite3Fts5MallocZero(&rc, nSpace);
  if( a==0 ) goto decode_out;
  if( n>0 ) memcpy(a, aBlob, n);

  fts5DecodeRowid(iRowid, &iSegid, &bDlidx, &iHeight, &iPgno);

  fts5DebugRowid(&rc, &s, iRowid);
  if( bDlidx ){
    Fts5Data dlidx;
    Fts5DlidxLvl lvl;

    dlidx.p = a;
    dlidx.nn = n;

    memset(&lvl, 0, sizeof(Fts5DlidxLvl));
    lvl.pData = &dlidx;
    lvl.iLeafPgno = iPgno;

    for(fts5DlidxLvlNext(&lvl); lvl.bEof==0; fts5DlidxLvlNext(&lvl)){
      sqlite3Fts5BufferAppendPrintf(&rc, &s, 
          " %d(%lld)", lvl.iLeafPgno, lvl.iRowid
      );
    }
  }else if( iSegid==0 ){
    if( iRowid==FTS5_AVERAGES_ROWID ){
      fts5DecodeAverages(&rc, &s, a, n);
    }else{
      fts5DecodeStructure(&rc, &s, a, n);
    }
  }else if( eDetailNone ){
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;
    int iPgidxOff = szLeaf = fts5GetU16(&a[2]);
    int iTermOff;
    int nKeep = 0;
    int iOff;

    memset(&term, 0, sizeof(Fts5Buffer));

    /* Decode any entries that occur before the first term. */
    if( szLeaf<n ){
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], iTermOff);
    }else{
      iTermOff = szLeaf;
    }
    fts5DecodeRowidList(&rc, &s, &a[4], iTermOff-4);

    iOff = iTermOff;
    while( iOff<szLeaf ){
      int nAppend;

      /* Read the term data for the next term*/
      iOff += fts5GetVarint32(&a[iOff], nAppend);
      term.n = nKeep;
      fts5BufferAppendBlob(&rc, &term, nAppend, &a[iOff]);
      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += nAppend;

      /* Figure out where the doclist for this term ends */
      if( iPgidxOff<n ){
        int nIncr;
        iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nIncr);
        iTermOff += nIncr;
      }else{
        iTermOff = szLeaf;
      }

      fts5DecodeRowidList(&rc, &s, &a[iOff], iTermOff-iOff);
      iOff = iTermOff;
      if( iOff<szLeaf ){
        iOff += fts5GetVarint32(&a[iOff], nKeep);
      }
    }

    fts5BufferFree(&term);
  }else{
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;                   /* Offset of pgidx in a[] */
    int iPgidxOff;
    int iPgidxPrev = 0;           /* Previous value read from pgidx */
    int iTermOff = 0;
    int iRowidOff = 0;
    int iOff;
    int nDoclist;

    memset(&term, 0, sizeof(Fts5Buffer));

    if( n<4 ){
      sqlite3Fts5BufferSet(&rc, &s, 7, (const u8*)"corrupt");
      goto decode_out;
    }else{
      iRowidOff = fts5GetU16(&a[0]);
      iPgidxOff = szLeaf = fts5GetU16(&a[2]);
      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], iTermOff);
      }else if( iPgidxOff>n ){
        rc = FTS5_CORRUPT;
        goto decode_out;
      }
    }

    /* Decode the position list tail at the start of the page */
    if( iRowidOff!=0 ){
      iOff = iRowidOff;
    }else if( iTermOff!=0 ){
      iOff = iTermOff;
    }else{
      iOff = szLeaf;
    }
    if( iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodePoslist(&rc, &s, &a[4], iOff-4);

    /* Decode any more doclist data that appears on the page before the
    ** first term. */
    nDoclist = (iTermOff ? iTermOff : szLeaf) - iOff;
    if( nDoclist+iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodeDoclist(&rc, &s, &a[iOff], nDoclist);

    while( iPgidxOff<n && rc==SQLITE_OK ){
      int bFirst = (iPgidxOff==szLeaf);     /* True for first term on page */
      int nByte;                            /* Bytes of data */
      int iEnd;
      
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nByte);
      iPgidxPrev += nByte;
      iOff = iPgidxPrev;

      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], nByte);
        iEnd = iPgidxPrev + nByte;
      }else{
        iEnd = szLeaf;
      }
      if( iEnd>szLeaf ){
        rc = FTS5_CORRUPT;
        break;
      }

      if( bFirst==0 ){
        iOff += fts5GetVarint32(&a[iOff], nByte);
        if( nByte>term.n ){
          rc = FTS5_CORRUPT;
          break;
        }
        term.n = nByte;
      }
      iOff += fts5GetVarint32(&a[iOff], nByte);
      if( iOff+nByte>n ){
        rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferAppendBlob(&rc, &term, nByte, &a[iOff]);
      iOff += nByte;

      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += fts5DecodeDoclist(&rc, &s, &a[iOff], iEnd-iOff);
    }

    fts5BufferFree(&term);
  }
  
 decode_out:
  sqlite3_free(a);
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)s.p, s.n, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  fts5BufferFree(&s);
}